

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O2

Matcher<const_std::unique_ptr<int,_std::default_delete<int>_>_&> * __thiscall
testing::internal::PointeeMatcher::operator_cast_to_Matcher
          (Matcher<const_std::unique_ptr<int,_std::default_delete<int>_>_&> *__return_storage_ptr__,
          PointeeMatcher *this)

{
  Impl<const_std::unique_ptr<int,_std::default_delete<int>_>_&> *this_00;
  
  this_00 = (Impl<const_std::unique_ptr<int,_std::default_delete<int>_>_&> *)operator_new(0x20);
  PointeeMatcher<int>::Impl<const_std::unique_ptr<int,_std::default_delete<int>_>_&>::Impl
            (this_00,(int *)this);
  Matcher<const_std::unique_ptr<int,_std::default_delete<int>_>_&>::Matcher
            (__return_storage_ptr__,
             (MatcherInterface<const_std::unique_ptr<int,_std::default_delete<int>_>_&> *)this_00);
  return __return_storage_ptr__;
}

Assistant:

operator Matcher<Pointer>() const {
    return Matcher<Pointer>(new Impl<const Pointer&>(matcher_));
  }